

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynlib_unix.cpp
# Opt level: O0

PTESTFUNC __thiscall trun::DynLibLinux::FindExportedSymbol(DynLibLinux *this,string *symbolName)

{
  void *pvVar1;
  Log *this_00;
  reference pvVar2;
  char *pcVar3;
  void *ptrInvoke;
  undefined1 local_40 [8];
  string exportName;
  string *symbolName_local;
  DynLibLinux *this_local;
  
  exportName.field_2._8_8_ = symbolName;
  std::__cxx11::string::string((string *)local_40,symbolName);
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                      0);
  if (*pvVar2 == '_') {
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40,1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,pvVar2)
    ;
  }
  pvVar1 = this->handle;
  pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40)
  ;
  this_local = (DynLibLinux *)dlsym(pvVar1,pcVar3);
  if (this_local == (DynLibLinux *)0x0) {
    this_00 = this->pLogger;
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_40);
    gnilk::Log::Debug<char_const*,char_const*>
              (this_00,"FindExportedSymbol, unable to find symbol \'%s\'",pcVar3);
    this_local = (DynLibLinux *)0x0;
  }
  std::__cxx11::string::~string((string *)local_40);
  return (PTESTFUNC)this_local;
}

Assistant:

PTESTFUNC DynLibLinux::FindExportedSymbol(const std::string &symbolName) {
  
    std::string exportName = symbolName;
    if (exportName[0] == '_') {
        exportName = &exportName[1];
    }

    void *ptrInvoke = dlsym(handle, exportName.c_str());
    if (ptrInvoke == nullptr) {
        pLogger->Debug("FindExportedSymbol, unable to find symbol '%s'", exportName.c_str());
        return nullptr;
    }
    return (PTESTFUNC)ptrInvoke;
}